

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

double calculator::toAny<double>(string *s)

{
  double t;
  stringstream ss;
  double local_198;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(local_180,(string *)s);
  std::istream::_M_extract<double>((double *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  return local_198;
}

Assistant:

inline T toAny(const std::string& s) {
    std::stringstream ss;
    ss << s;
    T t;
    ss >> t;
    return t;
}